

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O2

void VE4_C(uint8_t *dst)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  long lVar7;
  
  bVar1 = dst[-0x21];
  bVar2 = dst[-0x20];
  bVar3 = dst[-0x1f];
  bVar4 = dst[-0x1e];
  bVar5 = dst[-0x1d];
  bVar6 = dst[-0x1c];
  for (lVar7 = 0; lVar7 != 0x80; lVar7 = lVar7 + 0x20) {
    dst[lVar7] = (uint8_t)((uint)bVar1 + (uint)bVar3 + 2 + (uint)bVar2 * 2 >> 2);
    dst[lVar7 + 1] = (uint8_t)((uint)bVar2 + (uint)bVar4 + 2 + (uint)bVar3 * 2 >> 2);
    dst[lVar7 + 2] = (uint8_t)((uint)bVar3 + (uint)bVar4 * 2 + 2 + (uint)bVar5 >> 2);
    dst[lVar7 + 3] = (uint8_t)((uint)bVar4 + (uint)bVar5 * 2 + 2 + (uint)bVar6 >> 2);
  }
  return;
}

Assistant:

static void VE4_C(uint8_t* dst) {    // vertical
  const uint8_t* top = dst - BPS;
  const uint8_t vals[4] = {
    AVG3(top[-1], top[0], top[1]),
    AVG3(top[ 0], top[1], top[2]),
    AVG3(top[ 1], top[2], top[3]),
    AVG3(top[ 2], top[3], top[4])
  };
  int i;
  for (i = 0; i < 4; ++i) {
    memcpy(dst + i * BPS, vals, sizeof(vals));
  }
}